

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

int __thiscall
TPZCheckMesh::VerifyCompatibilityBetweenNShapesAndBlockSize(TPZCheckMesh *this,int connect)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  TPZConnect *this_00;
  int64_t iVar6;
  undefined8 *in_RDI;
  int blsize;
  int seqnum;
  int dofsize;
  TPZConnect *df;
  int check;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  TPZChunkVector<TPZConnect,_10> *in_stack_ffffffffffffffe0;
  uint local_18;
  uint local_4;
  
  TPZCompMesh::ConnectVec((TPZCompMesh *)*in_RDI);
  this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                      (in_stack_ffffffffffffffe0,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar3 = TPZConnect::HasDependency(this_00);
  if ((((iVar3 != 0) || (bVar1 = TPZConnect::IsCondensed(this_00), bVar1)) ||
      (iVar3 = TPZConnect::NElConnected(this_00), iVar3 == 0)) ||
     (iVar6 = TPZConnect::SequenceNumber(this_00), iVar6 == -1)) {
    local_4 = 1;
  }
  else {
    uVar4 = TPZConnect::NShape(this_00);
    bVar2 = TPZConnect::NState(this_00);
    iVar3 = uVar4 * bVar2;
    TPZConnect::SequenceNumber(this_00);
    TPZCompMesh::Block((TPZCompMesh *)*in_RDI);
    iVar5 = TPZBlock::Size((TPZBlock *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
    local_18 = (uint)(iVar5 == iVar3);
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int TPZCheckMesh::VerifyCompatibilityBetweenNShapesAndBlockSize(int connect) {
	int check = 1;
	TPZConnect &df = fMesh->ConnectVec()[connect];
	if(df.HasDependency() || df.IsCondensed() || !df.NElConnected() || df.SequenceNumber() == -1) return check;
	int dofsize = df.NShape()*df.NState();
	// check the consistency between the block size and the data structure of the connect
	{
		int seqnum = df.SequenceNumber();
		int blsize = fMesh->Block().Size(seqnum);
		if (blsize != dofsize) {
			check = 0;
		}
	}
	return check;
}